

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_prec.c
# Opt level: O2

int get_symbol_cost(aom_cdf_prob *cdf,int symbol)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  if (symbol == 0) {
    uVar3 = 0;
  }
  else {
    uVar3 = (uint)(ushort)(0x8000 - cdf[(long)symbol + -1]);
  }
  uVar3 = (-(uint)cdf[symbol] - 0x8000 & 0xffff) - uVar3;
  uVar1 = 4;
  if (4 < (int)uVar3) {
    uVar1 = uVar3;
  }
  uVar3 = 0x7fff;
  if ((ushort)uVar1 < 0x7fff) {
    uVar3 = uVar1;
  }
  uVar3 = uVar3 & 0xffff;
  uVar1 = 0x1f;
  if (uVar3 != 0) {
    for (; uVar3 >> uVar1 == 0; uVar1 = uVar1 - 1) {
    }
  }
  uVar3 = uVar3 << ((byte)(~uVar1 + 0xf) & 0x1f);
  uVar2 = (uint)((ulong)uVar3 * 0x100 + 0x4000 >> 0xf);
  return (~uVar1 + 0xf) * 0x200 +
         (uint)*(ushort *)
                (block_size_high +
                (ulong)((uVar3 < 0x40 | uVar2 | 0xff - uVar2 >> 0x17) & 0xff) * 2 + 0x10);
}

Assistant:

static inline int get_symbol_cost(const aom_cdf_prob *cdf, int symbol) {
  const aom_cdf_prob cur_cdf = AOM_ICDF(cdf[symbol]);
  const aom_cdf_prob prev_cdf = symbol ? AOM_ICDF(cdf[symbol - 1]) : 0;
  const aom_cdf_prob p15 = AOMMAX(cur_cdf - prev_cdf, EC_MIN_PROB);

  return av1_cost_symbol(p15);
}